

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

mp_int * crt_modpow(mp_int *base,mp_int *exp,mp_int *mod,mp_int *p,mp_int *q,mp_int *iqmp)

{
  uint yes;
  mp_int *r;
  mp_int *r_00;
  mp_int *exponent;
  mp_int *exponent_00;
  mp_int *pmVar1;
  mp_int *b;
  mp_int *a;
  mp_int *x;
  mp_int *r_01;
  mp_int *pmVar2;
  uint presult_too_small;
  mp_int *base_mod_q;
  mp_int *base_mod_p;
  mp_int *ret;
  mp_int *ret0;
  mp_int *multiplier;
  mp_int *diff;
  mp_int *qresult;
  mp_int *presult;
  mp_int *qexp;
  mp_int *pexp;
  mp_int *qm1;
  mp_int *pm1;
  mp_int *iqmp_local;
  mp_int *q_local;
  mp_int *p_local;
  mp_int *mod_local;
  mp_int *exp_local;
  mp_int *base_local;
  
  r = mp_copy(p);
  mp_sub_integer_into(r,r,1);
  r_00 = mp_copy(q);
  mp_sub_integer_into(r_00,r_00,1);
  exponent = mp_mod(exp,r);
  exponent_00 = mp_mod(exp,r_00);
  pmVar1 = mp_mod(base,p);
  b = mp_modpow(pmVar1,exponent,p);
  mp_free(pmVar1);
  pmVar1 = mp_mod(base,q);
  a = mp_modpow(pmVar1,exponent_00,q);
  mp_free(pmVar1);
  yes = mp_cmp_hs(a,b);
  mp_cond_add_into(b,b,p,yes);
  pmVar1 = mp_sub(b,a);
  x = mp_mul(iqmp,q);
  r_01 = mp_mul(x,pmVar1);
  mp_add_into(r_01,r_01,a);
  pmVar2 = mp_mod(r_01,mod);
  mp_free(r);
  mp_free(r_00);
  mp_free(exponent);
  mp_free(exponent_00);
  mp_free(b);
  mp_free(a);
  mp_free(pmVar1);
  mp_free(x);
  mp_free(r_01);
  return pmVar2;
}

Assistant:

static mp_int *crt_modpow(mp_int *base, mp_int *exp, mp_int *mod,
                          mp_int *p, mp_int *q, mp_int *iqmp)
{
    mp_int *pm1, *qm1, *pexp, *qexp, *presult, *qresult;
    mp_int *diff, *multiplier, *ret0, *ret;

    /*
     * Reduce the exponent mod phi(p) and phi(q), to save time when
     * exponentiating mod p and mod q respectively. Of course, since p
     * and q are prime, phi(p) == p-1 and similarly for q.
     */
    pm1 = mp_copy(p);
    mp_sub_integer_into(pm1, pm1, 1);
    qm1 = mp_copy(q);
    mp_sub_integer_into(qm1, qm1, 1);
    pexp = mp_mod(exp, pm1);
    qexp = mp_mod(exp, qm1);

    /*
     * Do the two modpows.
     */
    mp_int *base_mod_p = mp_mod(base, p);
    presult = mp_modpow(base_mod_p, pexp, p);
    mp_free(base_mod_p);
    mp_int *base_mod_q = mp_mod(base, q);
    qresult = mp_modpow(base_mod_q, qexp, q);
    mp_free(base_mod_q);

    /*
     * Recombine the results. We want a value which is congruent to
     * qresult mod q, and to presult mod p.
     *
     * We know that iqmp * q is congruent to 1 * mod p (by definition
     * of iqmp) and to 0 mod q (obviously). So we start with qresult
     * (which is congruent to qresult mod both primes), and add on
     * (presult-qresult) * (iqmp * q) which adjusts it to be congruent
     * to presult mod p without affecting its value mod q.
     *
     * (If presult-qresult < 0, we add p to it to keep it positive.)
     */
    unsigned presult_too_small = mp_cmp_hs(qresult, presult);
    mp_cond_add_into(presult, presult, p, presult_too_small);

    diff = mp_sub(presult, qresult);
    multiplier = mp_mul(iqmp, q);
    ret0 = mp_mul(multiplier, diff);
    mp_add_into(ret0, ret0, qresult);

    /*
     * Finally, reduce the result mod n.
     */
    ret = mp_mod(ret0, mod);

    /*
     * Free all the intermediate results before returning.
     */
    mp_free(pm1);
    mp_free(qm1);
    mp_free(pexp);
    mp_free(qexp);
    mp_free(presult);
    mp_free(qresult);
    mp_free(diff);
    mp_free(multiplier);
    mp_free(ret0);

    return ret;
}